

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O3

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getBinaryLength(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  ValueLength VVar1;
  Exception *this_00;
  
  if ((**(byte **)this & 0xf8) == 0xc0) {
    VVar1 = (*(code *)(&DAT_001130b4 + *(int *)(&DAT_001130b4 + (ulong)(**(byte **)this - 0xc0) * 4)
                      ))();
    return VVar1;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,InvalidValueType,"Expecting type Binary");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }